

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O2

int __thiscall diy::Collection::add(Collection *this,Element e)

{
  int __type;
  int local_30 [2];
  unique_lock<std::recursive_mutex> local_28;
  value_type local_18;
  
  local_18 = e;
  Catch::clara::std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->elements_,&local_18);
  local_30[0] = -1;
  Catch::clara::std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->external_,local_30)
  ;
  critical_resource<int,_std::recursive_mutex>::access
            ((critical_resource<int,_std::recursive_mutex> *)local_30,(char *)&this->in_memory_,
             __type);
  *(int *)CONCAT44(local_30[1],local_30[0]) = *(int *)CONCAT44(local_30[1],local_30[0]) + 1;
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  return (int)((ulong)((long)(this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
}

Assistant:

int           add(Element e)                  { elements_.push_back(e); external_.push_back(-1); ++(*in_memory_.access()); return static_cast<int>(elements_.size()) - 1; }